

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InternalSwap(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  LogMessage *other_00;
  undefined1 auStack_98 [24];
  _Alloc_hider _Stack_80;
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  tStack_60;
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  tStack_48;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              ((LogMessage *)auStack_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    other_00 = internal::LogMessage::operator<<
                         ((LogMessage *)auStack_98,"CHECK failed: this != rhs: ");
    internal::LogFinisher::operator=((LogFinisher *)&tStack_60,other_00);
    internal::LogMessage::~LogMessage((LogMessage *)auStack_98);
  }
  auStack_98._16_8_ = &(other->super_RepeatedPtrFieldBase).current_size_;
  auStack_98._8_8_ = &(other->super_RepeatedPtrFieldBase).total_size_;
  auStack_98._0_8_ = &(other->super_RepeatedPtrFieldBase).rep_;
  tStack_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>._M_head_impl
       = (_Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>)
         (other->super_RepeatedPtrFieldBase).rep_;
  uVar1 = (other->super_RepeatedPtrFieldBase).current_size_;
  uVar3 = (other->super_RepeatedPtrFieldBase).total_size_;
  tStack_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>._12_4_ =
       uVar1;
  tStack_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<2UL,_int,_false>._M_head_impl = uVar3;
  tStack_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl =
       (other->super_RepeatedPtrFieldBase).arena_;
  tStack_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>._M_head_impl
       = (_Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>)
         (this->super_RepeatedPtrFieldBase).rep_;
  uVar2 = (this->super_RepeatedPtrFieldBase).current_size_;
  uVar4 = (this->super_RepeatedPtrFieldBase).total_size_;
  tStack_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>._12_4_ =
       uVar2;
  tStack_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<2UL,_int,_false>._M_head_impl = uVar4;
  tStack_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl =
       (this->super_RepeatedPtrFieldBase).arena_;
  _Stack_80._M_p = (pointer)other;
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)auStack_98,&tStack_48);
  auStack_98._0_8_ = &(this->super_RepeatedPtrFieldBase).rep_;
  auStack_98._8_8_ = &(this->super_RepeatedPtrFieldBase).total_size_;
  auStack_98._16_8_ = &(this->super_RepeatedPtrFieldBase).current_size_;
  _Stack_80._M_p = (pointer)this;
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)auStack_98,&tStack_60);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }